

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O1

int __thiscall
gmlc::networking::TcpAcceptor::connect(TcpAcceptor *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int *piVar2;
  undefined4 in_register_00000034;
  milliseconds tcount;
  long lVar3;
  int iVar4;
  undefined8 unaff_R15;
  bool bVar5;
  error_code ec;
  int local_50 [2];
  undefined8 local_48;
  timespec local_40;
  
  if ((this->state)._M_i == HALTED) {
    LOCK();
    (this->state)._M_i = OPENED;
    UNLOCK();
  }
  LOCK();
  bVar5 = (this->state)._M_i == OPENED;
  if (bVar5) {
    (this->state)._M_i = CONNECTING;
  }
  UNLOCK();
  if (bVar5) {
    lVar3 = 0;
    iVar4 = 0;
    do {
      if (iVar4 != 0) {
        return iVar4;
      }
      local_50[0] = 0;
      local_48 = std::_V2::system_category();
      ::asio::detail::reactive_socket_service<asio::ip::tcp>::bind
                ((this->acceptor_).impl_.service_,(int)this + 0x38,(sockaddr *)&this->endpoint_,
                 (socklen_t)local_50);
      if (local_50[0] == 0) {
        LOCK();
        (this->state)._M_i = CONNECTED;
        UNLOCK();
        iVar4 = 1;
LAB_004245ee:
        bVar5 = true;
      }
      else {
        if (lVar3 <= CONCAT44(in_register_00000034,__fd)) {
          local_40.tv_sec = 0;
          local_40.tv_nsec = 200000000;
          do {
            iVar1 = nanosleep(&local_40,&local_40);
            if (iVar1 != -1) break;
            piVar2 = __errno_location();
          } while (*piVar2 == 4);
          lVar3 = lVar3 + 200;
          goto LAB_004245ee;
        }
        bVar5 = false;
        LOCK();
        (this->state)._M_i = OPENED;
        UNLOCK();
      }
    } while (bVar5);
  }
  else {
    iVar4 = (int)CONCAT71((int7)((ulong)unaff_R15 >> 8),(this->state)._M_i == CONNECTED);
  }
  return iVar4;
}

Assistant:

bool TcpAcceptor::connect(std::chrono::milliseconds timeOut)
{
    if (state == AcceptingStates::HALTED) {
        state = AcceptingStates::OPENED;
    }
    AcceptingStates exp = AcceptingStates::OPENED;
    if (state.compare_exchange_strong(exp, AcceptingStates::CONNECTING)) {
        bool bindsuccess = false;
        std::chrono::milliseconds tcount{0};
        while (!bindsuccess) {
            std::error_code ec;
            acceptor_.bind(endpoint_, ec);
            if (ec) {
                if (tcount > timeOut) {
                    state = AcceptingStates::OPENED;
                    break;
                }
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
                tcount += std::chrono::milliseconds(200);
            } else {
                state = AcceptingStates::CONNECTED;
                bindsuccess = true;
            }
        }
        return bindsuccess;
    }
    return (state == AcceptingStates::CONNECTED);
}